

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateArrayLength(ValidationState_t *state,Instruction *inst)

{
  Op OVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  char *__s;
  DiagnosticStream *pDVar5;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar6;
  string local_c58;
  DiagnosticStream local_c38;
  int local_a5c;
  undefined1 local_a58 [4];
  int index;
  DiagnosticStream local_a38;
  Instruction *local_860;
  Instruction *last_member;
  size_type num_of_members;
  DiagnosticStream local_830;
  Instruction *local_658;
  Instruction *structure_type;
  DiagnosticStream local_630;
  DiagnosticStream local_458;
  Instruction *local_280;
  Instruction *pointer_ty;
  byte local_26d;
  uint32_t pointer_ty_id;
  undefined1 local_268 [3];
  bool untyped;
  DiagnosticStream local_248;
  Instruction *local_70;
  Instruction *result_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string instr_name;
  Instruction *inst_local;
  ValidationState_t *state_local;
  
  instr_name.field_2._8_8_ = inst;
  OVar1 = Instruction::opcode(inst);
  __s = spvOpcodeString(OVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,__s,(allocator<char> *)((long)&result_type + 7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,"Op",
                 &local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&result_type + 7));
  uVar2 = Instruction::type_id((Instruction *)instr_name.field_2._8_8_);
  local_70 = ValidationState_t::FindDef(state,uVar2);
  OVar1 = Instruction::opcode(local_70);
  if (((OVar1 == OpTypeInt) &&
      (uVar3 = Instruction::GetOperandAs<unsigned_int>(local_70,1), uVar3 == 0x20)) &&
     (uVar3 = Instruction::GetOperandAs<unsigned_int>(local_70,2), uVar3 == 0)) {
    OVar1 = Instruction::opcode((Instruction *)instr_name.field_2._8_8_);
    local_26d = OVar1 == OpUntypedArrayLengthKHR;
    iVar4 = 2;
    if ((bool)local_26d) {
      iVar4 = 3;
    }
    pointer_ty._4_4_ =
         ValidationState_t::GetOperandTypeId
                   (state,(Instruction *)instr_name.field_2._8_8_,(long)iVar4);
    local_280 = ValidationState_t::FindDef(state,pointer_ty._4_4_);
    if ((local_26d & 1) == 0) {
      OVar1 = Instruction::opcode(local_280);
      if (OVar1 != OpTypePointer) {
        ValidationState_t::diag
                  (&local_630,state,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_);
        pDVar5 = DiagnosticStream::operator<<(&local_630,(char (*) [25])"The Structure\'s type in ")
        ;
        pDVar5 = DiagnosticStream::operator<<
                           (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_40);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [7])0x57a457);
        uVar2 = Instruction::id((Instruction *)instr_name.field_2._8_8_);
        ValidationState_t::getIdName_abi_cxx11_((string *)&structure_type,state,uVar2);
        pDVar5 = DiagnosticStream::operator<<
                           (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&structure_type);
        pDVar5 = DiagnosticStream::operator<<
                           (pDVar5,(char (*) [39])" must be a pointer to an OpTypeStruct.");
        state_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        std::__cxx11::string::~string((string *)&structure_type);
        DiagnosticStream::~DiagnosticStream(&local_630);
        goto LAB_002259e8;
      }
    }
    else {
      OVar1 = Instruction::opcode(local_280);
      if (OVar1 != OpTypeUntypedPointerKHR) {
        ValidationState_t::diag
                  (&local_458,state,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_);
        pDVar5 = DiagnosticStream::operator<<
                           (&local_458,(char (*) [35])"Pointer must be an untyped pointer");
        state_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        DiagnosticStream::~DiagnosticStream(&local_458);
        goto LAB_002259e8;
      }
    }
    local_658 = (Instruction *)0x0;
    if ((local_26d & 1) == 0) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>(local_280,2);
      local_658 = ValidationState_t::FindDef(state,uVar3);
    }
    else {
      uVar3 = Instruction::GetOperandAs<unsigned_int>((Instruction *)instr_name.field_2._8_8_,2);
      local_658 = ValidationState_t::FindDef(state,uVar3);
    }
    OVar1 = Instruction::opcode(local_658);
    if (OVar1 == OpTypeStruct) {
      this = Instruction::operands(local_658);
      sVar6 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
      last_member = (Instruction *)(sVar6 - 1);
      uVar3 = Instruction::GetOperandAs<unsigned_int>(local_658,(size_t)last_member);
      local_860 = ValidationState_t::FindDef(state,uVar3);
      OVar1 = Instruction::opcode(local_860);
      if (OVar1 == OpTypeRuntimeArray) {
        local_a5c = 3;
        if ((local_26d & 1) != 0) {
          local_a5c = 4;
        }
        uVar3 = Instruction::GetOperandAs<unsigned_int>
                          ((Instruction *)instr_name.field_2._8_8_,(long)local_a5c);
        if ((undefined1 *)(ulong)uVar3 ==
            (undefined1 *)
            ((long)&last_member[-1].uses_.
                    super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7U)) {
          state_local._4_4_ = SPV_SUCCESS;
        }
        else {
          ValidationState_t::diag
                    (&local_c38,state,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_);
          pDVar5 = DiagnosticStream::operator<<(&local_c38,(char (*) [21])"The array member in ");
          pDVar5 = DiagnosticStream::operator<<
                             (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_40);
          pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [7])0x57a457);
          uVar2 = Instruction::id((Instruction *)instr_name.field_2._8_8_);
          ValidationState_t::getIdName_abi_cxx11_(&local_c58,state,uVar2);
          pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_c58);
          pDVar5 = DiagnosticStream::operator<<
                             (pDVar5,(char (*) [40])" must be the last member of the struct.");
          state_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          std::__cxx11::string::~string((string *)&local_c58);
          DiagnosticStream::~DiagnosticStream(&local_c38);
        }
      }
      else {
        ValidationState_t::diag
                  (&local_a38,state,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_);
        pDVar5 = DiagnosticStream::operator<<
                           (&local_a38,(char (*) [32])"The Structure\'s last member in ");
        pDVar5 = DiagnosticStream::operator<<
                           (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_40);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [7])0x57a457);
        uVar2 = Instruction::id((Instruction *)instr_name.field_2._8_8_);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_a58,state,uVar2);
        pDVar5 = DiagnosticStream::operator<<
                           (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a58);
        pDVar5 = DiagnosticStream::operator<<
                           (pDVar5,(char (*) [32])" must be an OpTypeRuntimeArray.");
        state_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        std::__cxx11::string::~string((string *)local_a58);
        DiagnosticStream::~DiagnosticStream(&local_a38);
      }
    }
    else {
      ValidationState_t::diag
                (&local_830,state,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_);
      pDVar5 = DiagnosticStream::operator<<(&local_830,(char (*) [25])"The Structure\'s type in ");
      pDVar5 = DiagnosticStream::operator<<
                         (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_40);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [7])0x57a457);
      uVar2 = Instruction::id((Instruction *)instr_name.field_2._8_8_);
      ValidationState_t::getIdName_abi_cxx11_((string *)&num_of_members,state,uVar2);
      pDVar5 = DiagnosticStream::operator<<
                         (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&num_of_members);
      pDVar5 = DiagnosticStream::operator<<
                         (pDVar5,(char (*) [39])" must be a pointer to an OpTypeStruct.");
      state_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      std::__cxx11::string::~string((string *)&num_of_members);
      DiagnosticStream::~DiagnosticStream(&local_830);
    }
  }
  else {
    ValidationState_t::diag
              (&local_248,state,SPV_ERROR_INVALID_ID,(Instruction *)instr_name.field_2._8_8_);
    pDVar5 = DiagnosticStream::operator<<(&local_248,(char (*) [20])"The Result Type of ");
    pDVar5 = DiagnosticStream::operator<<
                       (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40);
    pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [7])0x57a457);
    uVar2 = Instruction::id((Instruction *)instr_name.field_2._8_8_);
    ValidationState_t::getIdName_abi_cxx11_((string *)local_268,state,uVar2);
    pDVar5 = DiagnosticStream::operator<<
                       (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_268);
    pDVar5 = DiagnosticStream::operator<<
                       (pDVar5,(char (*) [51])" must be OpTypeInt with width 32 and signedness 0.");
    state_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
    std::__cxx11::string::~string((string *)local_268);
    DiagnosticStream::~DiagnosticStream(&local_248);
  }
LAB_002259e8:
  pointer_ty_id = 1;
  std::__cxx11::string::~string((string *)local_40);
  return state_local._4_4_;
}

Assistant:

spv_result_t ValidateArrayLength(ValidationState_t& state,
                                 const Instruction* inst) {
  std::string instr_name =
      "Op" + std::string(spvOpcodeString(static_cast<spv::Op>(inst->opcode())));

  // Result type must be a 32-bit unsigned int.
  auto result_type = state.FindDef(inst->type_id());
  if (result_type->opcode() != spv::Op::OpTypeInt ||
      result_type->GetOperandAs<uint32_t>(1) != 32 ||
      result_type->GetOperandAs<uint32_t>(2) != 0) {
    return state.diag(SPV_ERROR_INVALID_ID, inst)
           << "The Result Type of " << instr_name << " <id> "
           << state.getIdName(inst->id())
           << " must be OpTypeInt with width 32 and signedness 0.";
  }

  const bool untyped = inst->opcode() == spv::Op::OpUntypedArrayLengthKHR;
  auto pointer_ty_id = state.GetOperandTypeId(inst, (untyped ? 3 : 2));
  auto pointer_ty = state.FindDef(pointer_ty_id);
  if (untyped) {
    if (pointer_ty->opcode() != spv::Op::OpTypeUntypedPointerKHR) {
      return state.diag(SPV_ERROR_INVALID_ID, inst)
             << "Pointer must be an untyped pointer";
    }
  } else if (pointer_ty->opcode() != spv::Op::OpTypePointer) {
    return state.diag(SPV_ERROR_INVALID_ID, inst)
           << "The Structure's type in " << instr_name << " <id> "
           << state.getIdName(inst->id())
           << " must be a pointer to an OpTypeStruct.";
  }

  Instruction* structure_type = nullptr;
  if (untyped) {
    structure_type = state.FindDef(inst->GetOperandAs<uint32_t>(2));
  } else {
    structure_type = state.FindDef(pointer_ty->GetOperandAs<uint32_t>(2));
  }

  if (structure_type->opcode() != spv::Op::OpTypeStruct) {
    return state.diag(SPV_ERROR_INVALID_ID, inst)
           << "The Structure's type in " << instr_name << " <id> "
           << state.getIdName(inst->id())
           << " must be a pointer to an OpTypeStruct.";
  }

  auto num_of_members = structure_type->operands().size() - 1;
  auto last_member =
      state.FindDef(structure_type->GetOperandAs<uint32_t>(num_of_members));
  if (last_member->opcode() != spv::Op::OpTypeRuntimeArray) {
    return state.diag(SPV_ERROR_INVALID_ID, inst)
           << "The Structure's last member in " << instr_name << " <id> "
           << state.getIdName(inst->id()) << " must be an OpTypeRuntimeArray.";
  }

  // The array member must the index of the last element (the run time
  // array).
  const auto index = untyped ? 4 : 3;
  if (inst->GetOperandAs<uint32_t>(index) != num_of_members - 1) {
    return state.diag(SPV_ERROR_INVALID_ID, inst)
           << "The array member in " << instr_name << " <id> "
           << state.getIdName(inst->id())
           << " must be the last member of the struct.";
  }
  return SPV_SUCCESS;
}